

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_00;
  long lVar1;
  undefined1 *local_88;
  string data;
  char *local_60;
  undefined2 local_58 [4];
  char local_50 [16];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_40;
  string *local_38;
  
  if (this->inQuotes == false) {
    local_58[0] = 0;
    local_60 = (char *)0x1;
    data.field_2._8_8_ = local_58;
    local_40 = tokens;
    local_38 = arg;
    lVar1 = std::__cxx11::string::find((char)&data + '\x18',(ulong)(uint)(int)c);
    if ((undefined2 *)data.field_2._8_8_ != local_58) {
      operator_delete((void *)data.field_2._8_8_);
    }
    this_00 = local_40;
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)local_38);
      data.field_2._8_8_ = data.field_2._8_8_ & 0xffffffff00000000;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,local_88,data._M_dataplus._M_p + (long)local_88);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      emplace_back<Catch::Clara::Parser::Token>(this_00,(Token *)((long)&data.field_2 + 8));
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      if ((size_type *)local_88 != &data._M_string_length) {
        operator_delete(local_88);
      }
      return None;
    }
  }
  return this->mode;
}

Assistant:

Mode handlePositional(std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens) {
			if (inQuotes || std::string("\0", 1).find(c) == std::string::npos)
				return mode;

			std::string data = arg.substr(from, i - from);
			tokens.push_back(Token(Token::Positional, data));
			return None;
		}